

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O2

bool __thiscall WTF::Symbolize(WTF *this,void *pc,char *out,int out_size)

{
  char *__s1;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  undefined4 in_register_0000000c;
  long lVar8;
  LineReader *offset;
  off_t oVar9;
  int dest_size;
  ulong uVar10;
  uint64_t symbol_offset;
  int iVar11;
  uint64_t uVar12;
  ulong __n;
  char *start;
  char *eol;
  FileDescriptor wrapped_maps_fd;
  uint64_t start_address;
  char *local_4d0;
  char *cursor;
  uint64_t local_488;
  uint64_t end_address;
  LineReader reader;
  char buf [1024];
  
  offset = (LineReader *)CONCAT44(in_register_0000000c,out_size);
  dest_size = (int)out;
  if (dest_size < 0) goto LAB_001078d2;
  start_address = 0;
  if (dest_size == 0) {
    return false;
  }
  *(undefined1 *)pc = 0;
  SafeAppendString("(",(char *)pc,dest_size);
  local_4d0 = (char *)((long)pc + 1);
  do {
    iVar3 = open("/proc/self/maps",0);
    __n = (long)dest_size - 1U & 0xffffffff;
    wrapped_maps_fd.fd_ = iVar3;
    if (-1 < iVar3) {
      offset = &reader;
      reader.buf_ = buf;
      reader.buf_len_ = 0x400;
      iVar11 = 0;
      reader.fd_ = iVar3;
      reader.bol_ = reader.buf_;
      reader.eol_ = reader.buf_;
      reader.eod_ = reader.buf_;
      goto LAB_001074f3;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
LAB_001075ff:
  lVar8 = 0;
  iVar3 = -1;
  goto LAB_00107605;
LAB_001074f3:
  bVar2 = LineReader::ReadLine(&reader,&cursor,&eol);
  if (!bVar2) goto LAB_001075f0;
  cursor = GetHex(cursor,(char *)CONCAT44(eol._4_4_,(int)eol),&start_address);
  if ((cursor == (char *)CONCAT44(eol._4_4_,(int)eol)) || (*cursor != '-')) goto LAB_001075f0;
  cursor = cursor + 1;
  pcVar5 = GetHex(cursor,(char *)CONCAT44(eol._4_4_,(int)eol),&end_address);
  uVar12 = start_address;
  pcVar1 = (char *)CONCAT44(eol._4_4_,(int)eol);
  cursor = pcVar5;
  if ((pcVar5 == pcVar1) || (*pcVar5 != ' ')) goto LAB_001075ff;
  __s1 = pcVar5 + 1;
  cursor = __s1;
  if ((start_address <= this) && (this < end_address)) {
    lVar8 = -1;
    pcVar5 = pcVar5 + 2;
    for (pcVar6 = __s1; (start = pcVar5, pcVar6 < pcVar1 && (*pcVar6 != ' ')); pcVar6 = pcVar6 + 1)
    {
      lVar8 = lVar8 + -1;
      pcVar5 = start + 1;
      cursor = start;
    }
    offset = (LineReader *)-lVar8;
    if ((offset < (LineReader *)0x5) || (pcVar6 == pcVar1)) goto LAB_001075ff;
    iVar3 = bcmp(__s1,"r-x",3);
    if (iVar3 == 0) {
      cursor = start;
      cursor = GetHex(start,pcVar1,&local_488);
      offset = (LineReader *)CONCAT44(eol._4_4_,(int)eol);
      if (((LineReader *)cursor != offset) && (uVar10 = 0, (char)((LineReader *)cursor)->fd_ == ' ')
         ) {
        if (iVar11 == 0) {
          uVar12 = uVar10;
        }
        lVar8 = uVar12 - local_488;
        goto LAB_00107869;
      }
      goto LAB_001075f0;
    }
  }
  iVar11 = iVar11 + 1;
  goto LAB_001074f3;
LAB_001075f0:
  iVar3 = -1;
  lVar8 = 0;
  goto LAB_00107605;
  while ((int)uVar10 < 2) {
LAB_00107869:
    cursor = (char *)((long)&((LineReader *)cursor)->fd_ + 1);
    if (offset <= cursor) break;
    if ((char)((LineReader *)cursor)->fd_ == ' ') {
      uVar10 = (ulong)((int)uVar10 + 1);
      goto LAB_00107869;
    }
  }
  iVar3 = -1;
  if ((LineReader *)cursor != offset) {
    do {
      iVar3 = open(cursor,0);
      if (-1 < iVar3) goto LAB_00107605;
      piVar4 = __errno_location();
      pcVar1 = local_4d0;
    } while (*piVar4 == 4);
    strncpy(local_4d0,cursor,__n);
    pcVar1[(long)dest_size + -2] = '\0';
    iVar3 = -1;
  }
LAB_00107605:
  FileDescriptor::~FileDescriptor(&wrapped_maps_fd);
  if (iVar3 < 0) {
    if (*local_4d0 == '\0') {
      return false;
    }
    *(undefined1 *)((long)pc + __n) = 0;
    SafeAppendString("+0x",(char *)pc,dest_size);
    SafeAppendHexNumber((long)this - lVar8,(char *)pc,dest_size);
    SafeAppendString(")",(char *)pc,dest_size);
    return true;
  }
  eol._0_4_ = iVar3;
  bVar2 = ReadFromOffsetExact(iVar3,buf,0,(off_t)offset);
  uVar12 = start_address;
  if ((bVar2 && buf._0_4_ == 0x464c457f) &&
     (bVar2 = ReadFromOffsetExact(iVar3,buf,0,
                                  CONCAT71((int7)((ulong)offset >> 8),buf._0_4_ == 0x464c457f)),
     bVar2)) {
    symbol_offset = 0;
    if (buf._16_2_ == 3) {
      symbol_offset = uVar12;
    }
    oVar9 = 2;
    bVar2 = GetSectionHeaderByType(iVar3,buf._60_2_,buf._40_8_,2,(Elf64_Shdr *)&reader);
    if (bVar2) {
      bVar2 = ReadFromOffsetExact(iVar3,&cursor,
                                  ((ulong)reader.eod_ & 0xffffffff) * 0x40 + buf._40_8_,oVar9);
      if (!bVar2) goto LAB_001077a5;
      bVar2 = FindSymbol((uint64_t)this,iVar3,(char *)pc,dest_size,symbol_offset,
                         (Elf64_Shdr *)&cursor,(Elf64_Shdr *)&reader);
      if (!bVar2) goto LAB_001076eb;
    }
    else {
LAB_001076eb:
      oVar9 = 0xb;
      bVar2 = GetSectionHeaderByType(iVar3,buf._60_2_,buf._40_8_,0xb,(Elf64_Shdr *)&reader);
      if (((!bVar2) ||
          (bVar2 = ReadFromOffsetExact(iVar3,&cursor,
                                       ((ulong)reader.eod_ & 0xffffffff) * 0x40 + buf._40_8_,oVar9),
          !bVar2)) ||
         (bVar2 = FindSymbol((uint64_t)this,iVar3,(char *)pc,dest_size,symbol_offset,
                             (Elf64_Shdr *)&cursor,(Elf64_Shdr *)&reader), !bVar2))
      goto LAB_001077a5;
    }
    bVar2 = Demangle((char *)pc,buf,0x100);
    if (bVar2) {
      sVar7 = strlen(buf);
      if (sVar7 + 1 <= ((ulong)out & 0xffffffff)) {
        if (0xff < sVar7) {
LAB_001078d2:
          abort();
        }
        memcpy(pc,buf,sVar7 + 1);
      }
    }
    bVar2 = true;
  }
  else {
LAB_001077a5:
    bVar2 = false;
  }
  FileDescriptor::~FileDescriptor((FileDescriptor *)&eol);
  return bVar2;
}

Assistant:

bool Symbolize(void *pc, char *out, int out_size) {
    SAFE_ASSERT(out_size >= 0);
    return SymbolizeAndDemangle(pc, out, out_size);
}